

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionEntryPointInfo::FunctionEntryPointInfo
          (FunctionEntryPointInfo *this,FunctionProxy *functionProxy,JavascriptMethod method,
          ThreadContext *context)

{
  ScriptContext *this_00;
  JavascriptLibrary *library;
  nullptr_t local_30;
  ThreadContext *local_28;
  ThreadContext *context_local;
  JavascriptMethod method_local;
  FunctionProxy *functionProxy_local;
  FunctionEntryPointInfo *this_local;
  
  local_28 = context;
  context_local = (ThreadContext *)method;
  method_local = (JavascriptMethod)functionProxy;
  functionProxy_local = (FunctionProxy *)this;
  this_00 = FunctionProxy::GetScriptContext(functionProxy);
  library = ScriptContext::GetLibrary(this_00);
  EntryPointInfo::EntryPointInfo(&this->super_EntryPointInfo,method,library,local_28,false);
  (this->super_EntryPointInfo).super_ProxyEntryPointInfo.super_ExpirableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01de06d8;
  Memory::WriteBarrierPtr<Js::FunctionProxy>::WriteBarrierPtr
            (&this->functionProxy,(FunctionProxy *)method_local);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::FunctionEntryPointInfo>::WriteBarrierPtr
            (&this->nextEntryPoint,&local_30);
  this->localVarSlotsOffset = -1;
  this->localVarChangedOffset = -1;
  this->callsCount = 0;
  this->jitMode = Interpreter;
  return;
}

Assistant:

FunctionEntryPointInfo::FunctionEntryPointInfo(FunctionProxy * functionProxy, Js::JavascriptMethod method, ThreadContext* context) :
        EntryPointInfo(method, functionProxy->GetScriptContext()->GetLibrary(), context),
        localVarSlotsOffset(Js::Constants::InvalidOffset),
        localVarChangedOffset(Js::Constants::InvalidOffset),
        callsCount(0),
        jitMode(ExecutionMode::Interpreter),
        functionProxy(functionProxy),
        nextEntryPoint(nullptr)
    {
    }